

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O2

double __thiscall
DetectorExample_LUX_RUN03::FitS2
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,LCE map)

{
  ostream *poVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  __x = SQRT(yPos_mm * yPos_mm + xPos_mm * xPos_mm);
  dVar2 = pow(__x,3.0);
  dVar3 = pow(__x,4.0);
  dVar4 = pow(__x,5.0);
  dVar5 = pow(__x,6.0);
  dVar6 = pow(__x,7.0);
  dVar2 = (dVar6 * -7.3989e-12 +
          dVar5 * 5.6513e-09 +
          dVar4 * -1.6953e-06 +
          dVar3 * 0.0002474 + dVar2 * -0.017144 + __x * __x * 0.38126 + __x * 6.2275 + 9156.3) /
          9156.3;
  if ((((dVar2 < 0.5) || (1.5 < dVar2)) || (NAN(dVar2))) && (__x < (this->super_VDetector).radmax))
  {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "ERR: S2 corrections exceed a 50% difference. Are you sure you didn\'t forget to change LUX numbers for your own detector??"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar2 = 1.0;
  }
  return dVar2;
}

Assistant:

double FitS2(double xPos_mm, double yPos_mm, LCE map) override {
    double radius = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));

    double finalCorr =  // unitless, 1.000 at detector center
        9156.3 + 6.22750 * pow(radius, 1.) + 0.38126 * pow(radius, 2.) -
        0.017144 * pow(radius, 3.) + 0.0002474 * pow(radius, 4.) -
        1.6953e-6 * pow(radius, 5.) + 5.6513e-9 * pow(radius, 6.) -
        7.3989e-12 * pow(radius, 7.);
    finalCorr /= 9156.3;
    if ((finalCorr < 0.5 || finalCorr > 1.5 || std::isnan(finalCorr)) &&
        radius < radmax) {
      cerr << "ERR: S2 corrections exceed a 50% difference. Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return 1.;
    } else
      return finalCorr;
  }